

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.h
# Opt level: O1

bool __thiscall text_subtitles::YUVQuad::operator<(YUVQuad *this,YUVQuad *second)

{
  bool bVar1;
  
  bVar1 = this->Y < second->Y;
  if (((this->Y == second->Y) && (bVar1 = this->Cr < second->Cr, this->Cr == second->Cr)) &&
     (bVar1 = this->Cb < second->Cb, this->Cb == second->Cb)) {
    bVar1 = this->alpha < second->alpha;
  }
  return bVar1;
}

Assistant:

bool operator<(const YUVQuad& second) const
    {
        if (Y != second.Y)
            return Y < second.Y;
        if (Cr != second.Cr)
            return Cr < second.Cr;
        if (Cb != second.Cb)
            return Cb < second.Cb;

        return alpha < second.alpha;
    }